

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::MultiReporter::assertionEnded(MultiReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  int iVar3;
  reference this_00;
  IEventListener *pIVar4;
  ReporterPreferences *pRVar5;
  byte local_41;
  unique_ptr<Catch::IEventListener> *reporterish;
  iterator __end1;
  iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  *__range1;
  bool reportByDefault;
  AssertionStats *assertionStats_local;
  MultiReporter *this_local;
  
  OVar2 = AssertionResult::getResultType(&assertionStats->assertionResult);
  local_41 = 1;
  if (OVar2 == Ok) {
    iVar3 = (*((this->super_IEventListener).m_config)->_vptr_IConfig[4])();
    local_41 = (byte)iVar3;
  }
  __end1 = std::
           vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ::begin(&this->m_reporterLikes);
  reporterish = (unique_ptr<Catch::IEventListener> *)
                std::
                vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
                ::end(&this->m_reporterLikes);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
                                *)&reporterish);
    if (!bVar1) {
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
              ::operator*(&__end1);
    if ((local_41 & 1) == 0) {
      pIVar4 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
      pRVar5 = Catch::IEventListener::getPreferences(pIVar4);
      if ((pRVar5->shouldReportAllAssertions & 1U) != 0) goto LAB_001b40aa;
    }
    else {
LAB_001b40aa:
      pIVar4 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
      (*pIVar4->_vptr_IEventListener[0xd])(pIVar4,assertionStats);
    }
    __gnu_cxx::
    __normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void MultiReporter::assertionEnded( AssertionStats const& assertionStats ) {
        const bool reportByDefault =
            assertionStats.assertionResult.getResultType() != ResultWas::Ok ||
            m_config->includeSuccessfulResults();

        for ( auto & reporterish : m_reporterLikes ) {
            if ( reportByDefault ||
                 reporterish->getPreferences().shouldReportAllAssertions ) {
                    reporterish->assertionEnded( assertionStats );
            }
        }
    }